

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::UnitTestOptions::FilterMatchesTest(string *test_case_name,string *test_name)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  char *pcVar4;
  size_t sVar5;
  size_type *psVar6;
  char *pcVar7;
  string *this;
  long in_FS_OFFSET;
  string negative;
  string positive;
  long *local_b8 [2];
  long local_a8 [2];
  char *local_98;
  char *local_90;
  char local_88;
  undefined7 uStack_87;
  char *local_78;
  long local_70;
  char local_68;
  undefined7 uStack_67;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (test_case_name->_M_dataplus)._M_p;
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + test_case_name->_M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_58.field_2._M_allocated_capacity = *psVar6;
    local_58.field_2._8_8_ = plVar3[3];
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar6;
    local_58._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_58._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  pcVar7 = FLAGS_gtest_filter_abi_cxx11_;
  pcVar4 = strchr(FLAGS_gtest_filter_abi_cxx11_,0x2d);
  local_70 = 0;
  local_68 = '\0';
  local_98 = &local_88;
  local_90 = (char *)0x0;
  local_88 = '\0';
  if (pcVar4 == (char *)0x0) {
    local_78 = &local_68;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,(ulong)pcVar7);
    pcVar4 = "";
    this = (string *)&local_98;
    pcVar7 = local_90;
  }
  else {
    local_b8[0] = local_a8;
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,pcVar7,pcVar4);
    this = (string *)&local_78;
    std::__cxx11::string::operator=(this,(string *)local_b8);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    local_b8[0] = local_a8;
    sVar5 = strlen(pcVar4 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,pcVar4 + 1,pcVar4 + sVar5 + 1);
    std::__cxx11::string::operator=((string *)&local_98,(string *)local_b8);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    if (local_70 != 0) goto LAB_00144928;
    pcVar4 = "*";
    pcVar7 = (char *)0x0;
  }
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar7,(ulong)pcVar4);
LAB_00144928:
  bVar2 = MatchesFilter(&local_58,local_78);
  if (bVar2) {
    bVar2 = MatchesFilter(&local_58,local_98);
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string &test_case_name,
                                        const std::string &test_name) {
  const std::string& full_name = test_case_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == NULL) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}